

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  uint32_t *puVar1;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  size_t sVar2;
  Variant *pVVar3;
  int iVar4;
  long lVar5;
  string *psVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ExecutionModel EVar12;
  uint32_t uVar13;
  uint uVar14;
  uint uVar15;
  SPIRVariable *pSVar16;
  SPIRType *pSVar17;
  Meta *pMVar18;
  SPIRConstant *pSVar19;
  mapped_type *pmVar20;
  mapped_type *this_01;
  SPIRExpression *pSVar21;
  runtime_error *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  undefined4 in_register_00000014;
  ID id;
  ulong uVar22;
  uint32_t uVar23;
  TypeID *pTVar24;
  uint *puVar25;
  ulong uVar26;
  uint32_t index;
  AccessChainMeta meta;
  string e;
  __node_gen_type __node_gen;
  SmallVector<unsigned_int,_8UL> indices;
  uint local_134;
  SPIRVariable *local_130;
  uint local_124;
  ulong local_120;
  uint32_t local_114;
  uint32_t local_110;
  uint32_t local_10c;
  uint *local_108;
  SPIRType *local_100;
  AccessChainMeta local_f8;
  uint local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  SmallVector<unsigned_int,_8UL> local_a8;
  string local_70;
  string local_50;
  
  local_120 = CONCAT44(in_register_00000014,length);
  pSVar16 = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  local_130 = pSVar16;
  if (pSVar16 == (SPIRVariable *)0x0) {
    id.id = 0;
    goto LAB_002c1802;
  }
  pSVar17 = Compiler::get_variable_data_type((Compiler *)this,pSVar16);
  bVar7 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(pSVar17->super_IVariant).self.id,DecorationBlock);
  sVar2 = (pSVar17->array).super_VectorView<unsigned_int>.buffer_size;
  bVar8 = variable_storage_requires_stage_io(this,pSVar16->storage);
  bVar9 = Compiler::has_decoration((Compiler *)this,(ID)ops[2],DecorationPatch);
  bVar10 = true;
  if (!bVar9) {
    bVar10 = is_patch_block(this,pSVar17);
  }
  if (local_130->storage == StorageClassInput) {
    bVar9 = false;
  }
  else if (local_130->storage == StorageClassOutput) {
    EVar12 = Compiler::get_execution_model((Compiler *)this);
    bVar9 = EVar12 != ExecutionModelTessellationControl;
  }
  else {
    bVar9 = true;
  }
  if (((bVar10 == false) || ((bVar7 && sVar2 == 0 && (local_130->storage != StorageClassInput)))) &&
     (!bVar9)) {
    local_10c = (local_130->super_IVariant).self.id;
    local_110 = ops[2];
    bVar9 = Compiler::is_builtin_variable((Compiler *)this,local_130);
    if ((!bVar9 || bVar7) ||
       ((uVar13 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(local_130->super_IVariant).self.id,
                             DecorationBuiltIn), uVar13 < 5 && (uVar13 != 2)))) {
      if ((local_10c == local_110) && (local_130->storage == StorageClassOutput)) {
        if (bVar7) {
          uVar14 = 4 - bVar10;
          if ((uint)local_120 <= uVar14) goto LAB_002c19ad;
          pSVar19 = Variant::get<spirv_cross::SPIRConstant>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + ops[uVar14]);
          bVar9 = CompilerGLSL::is_stage_output_block_member_masked
                            (&this->super_CompilerGLSL,local_130,(pSVar19->m).c[0].r[0].u32,true);
        }
        else {
          bVar9 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,local_130)
          ;
        }
        if (bVar9 != false) {
          return false;
        }
      }
LAB_002c19ad:
      local_f8.storage_physical_type = 0;
      local_f8.need_transpose = false;
      local_f8.storage_is_packed = false;
      local_f8.storage_is_invariant = false;
      local_f8.flattened_struct = false;
      local_f8.relaxed_precision = false;
      local_f8.access_meshlet_position_y = false;
      local_a8.super_VectorView<unsigned_int>.ptr = (uint *)&local_a8.stack_storage;
      local_a8.super_VectorView<unsigned_int>.buffer_size = 0;
      local_a8.buffer_capacity = 8;
      local_108 = ops;
      local_114 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      uVar23 = local_10c;
      uVar13 = local_110;
      bVar9 = local_10c != local_110;
      SmallVector<unsigned_int,_8UL>::reserve(&local_a8,(ulong)((int)local_120 - 2));
      iVar4 = -((uint)bVar9 + (uint)bVar10);
      uVar14 = iVar4 + 4;
      if (bVar10 == false) {
        uVar15 = this->next_metal_resource_ids
                 [(ulong)(local_130->storage != StorageClassInput) + 0xc];
        local_ec = uVar15;
        if (uVar23 != uVar13) goto LAB_002c1a78;
        SmallVector<unsigned_int,_8UL>::reserve
                  (&local_a8,local_a8.super_VectorView<unsigned_int>.buffer_size + 1);
        *(uint *)((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
                 local_a8.super_VectorView<unsigned_int>.buffer_size * 4) =
             local_108[(ulong)uVar14 - 1];
        local_a8.super_VectorView<unsigned_int>.buffer_size =
             local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
        local_124 = uVar15;
      }
      else {
        local_124 = this->next_metal_resource_ids
                    [(ulong)(local_130->storage != StorageClassInput) + 10];
        local_ec = local_124;
        if (uVar23 != uVar13) {
LAB_002c1a78:
          local_124 = local_108[2];
        }
      }
      puVar25 = local_108;
      uVar13 = local_114;
      local_100 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + *local_108);
      local_134 = Compiler::get_extended_decoration
                            ((Compiler *)this,puVar25[2],SPIRVCrossDecorationInterfaceMemberIndex);
      bVar9 = true;
      if (bVar8 && local_10c != local_110) {
        pSVar17 = Compiler::expression_type((Compiler *)this,local_124);
        bVar11 = Compiler::is_array((Compiler *)this,pSVar17);
        if (!bVar11) {
          bVar9 = Compiler::is_matrix((Compiler *)this,pSVar17);
          bVar9 = bVar9 || *(int *)&(pSVar17->super_IVariant).field_0xc == 0xf;
        }
      }
      if ((bVar7 || bVar8) && (bVar9)) {
        pSVar17 = Compiler::get_variable_element_type((Compiler *)this,local_130);
        if ((local_134 == 0xffffffff) && (uVar14 < (uint)local_120)) {
          pSVar19 = Compiler::get_constant((Compiler *)this,(ConstantID)puVar25[uVar14]);
          uVar14 = (pSVar19->m).c[0].r[0].u32;
          local_134 = Compiler::get_extended_member_decoration
                                ((Compiler *)this,(local_130->super_IVariant).self.id,uVar14,
                                 SPIRVCrossDecorationInterfaceMemberIndex);
          if (local_134 == 0xffffffff) {
            __assert_fail("index != uint32_t(-1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                          ,0x1f3e,
                          "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                         );
          }
          pSVar17 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               (pSVar17->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                               [uVar14].id);
          uVar14 = iVar4 + 5;
        }
        bVar7 = uVar14 < (uint)local_120;
        if (bVar8 && bVar7) {
          do {
            bVar7 = Compiler::is_array((Compiler *)this,pSVar17);
            if (((!bVar7) && (bVar7 = Compiler::is_matrix((Compiler *)this,pSVar17), !bVar7)) &&
               (*(int *)&(pSVar17->super_IVariant).field_0xc != 0xf)) {
              bVar7 = true;
              goto LAB_002c1d9e;
            }
            uVar22 = (ulong)puVar25[uVar14];
            if ((((this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size <= uVar22) ||
                (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr,
                pVVar3[uVar22].type != TypeConstant)) ||
               (pSVar19 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar22),
               pSVar19->specialization == true)) {
              this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e8,
                         "Trying to dynamically index into an array interface variable in tessellation. This is currently unsupported."
                         ,"");
              ::std::runtime_error::runtime_error(this_02,(string *)&local_e8);
              *(undefined ***)this_02 = &PTR__runtime_error_003f8e68;
              __cxa_throw(this_02,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if ((*(int *)&(pSVar17->super_IVariant).field_0xc == 0xf) &&
               (local_130->storage == StorageClassOutput)) {
              uVar13 = (pSVar19->m).c[0].r[0].u32;
              if (uVar13 != 0) {
                uVar23 = 0;
                do {
                  bVar7 = CompilerGLSL::is_stage_output_block_member_masked
                                    (&this->super_CompilerGLSL,local_130,uVar23,true);
                  if (!bVar7) {
                    local_134 = local_134 + 1;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar13 != uVar23);
              }
            }
            else {
              local_134 = local_134 + (pSVar19->m).c[0].r[0].u32;
            }
            uVar15 = (pSVar17->parent_type).id;
            if (uVar15 == 0) {
              if (*(int *)&(pSVar17->super_IVariant).field_0xc == 0xf) {
                uVar15 = (pSVar17->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                         [(pSVar19->m).c[0].r[0].u32].id;
                goto LAB_002c1cc1;
              }
            }
            else {
LAB_002c1cc1:
              pSVar17 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr + uVar15);
            }
            uVar14 = uVar14 + 1;
            puVar25 = local_108;
          } while (uVar14 < (uint)local_120);
          bVar7 = false;
        }
LAB_002c1d9e:
        if ((bVar8) &&
           ((bVar11 = Compiler::is_matrix((Compiler *)this,local_100), bVar11 ||
            (bVar11 = Compiler::is_array((Compiler *)this,local_100),
            bVar11 || *(int *)&(local_100->super_IVariant).field_0xc == 0xf)))) {
          if (uVar14 != (uint)local_120) {
            __assert_fail("i == length",
                          "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                          ,0x1f79,
                          "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                         );
          }
LAB_002c1e80:
          sVar2 = local_a8.super_VectorView<unsigned_int>.buffer_size;
          if (local_134 != 0xffffffff) {
            Compiler::set_extended_decoration
                      ((Compiler *)this,puVar25[1],SPIRVCrossDecorationInterfaceMemberIndex,
                       local_134);
            goto LAB_002c1ead;
          }
        }
        else {
          local_e8._M_dataplus._M_p._0_4_ = get_uint_type_id(this);
          uVar13 = local_114;
          local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffffff00;
          Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                    ((Compiler *)this,local_114,(uint *)&local_e8,&local_134,(bool *)&local_c8);
          SmallVector<unsigned_int,_8UL>::reserve
                    (&local_a8,local_a8.super_VectorView<unsigned_int>.buffer_size + 1);
          *(uint32_t *)
           ((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
           local_a8.super_VectorView<unsigned_int>.buffer_size * 4) = uVar13;
          local_134 = 0xffffffff;
          sVar2 = local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
          if (bVar7) {
            lVar5 = local_a8.super_VectorView<unsigned_int>.buffer_size * 4;
            local_a8.super_VectorView<unsigned_int>.buffer_size =
                 local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
            SmallVector<unsigned_int,_8UL>::insert
                      (&local_a8,
                       (uint *)((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)
                                       ->_M_p + lVar5 + 4),puVar25 + uVar14,
                       puVar25 + (local_120 & 0xffffffff));
            goto LAB_002c1e80;
          }
        }
        local_a8.super_VectorView<unsigned_int>.buffer_size = sVar2;
        Compiler::unset_extended_decoration
                  ((Compiler *)this,puVar25[1],SPIRVCrossDecorationInterfaceMemberIndex);
      }
      else {
        if (local_134 != 0xffffffff) {
          uVar23 = get_uint_type_id(this);
          local_e8._M_dataplus._M_p._0_4_ = uVar23;
          local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffffff00;
          Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                    ((Compiler *)this,uVar13,(uint *)&local_e8,&local_134,(bool *)&local_c8);
          SmallVector<unsigned_int,_8UL>::reserve
                    (&local_a8,local_a8.super_VectorView<unsigned_int>.buffer_size + 1);
          *(uint32_t *)
           ((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->_M_p +
           local_a8.super_VectorView<unsigned_int>.buffer_size * 4) = uVar13;
          local_a8.super_VectorView<unsigned_int>.buffer_size =
               local_a8.super_VectorView<unsigned_int>.buffer_size + 1;
        }
        local_134 = 0xffffffff;
        Compiler::unset_extended_decoration
                  ((Compiler *)this,puVar25[1],SPIRVCrossDecorationInterfaceMemberIndex);
        SmallVector<unsigned_int,_8UL>::insert
                  (&local_a8,
                   (uint *)((long)&((_Alloc_hider *)local_a8.super_VectorView<unsigned_int>.ptr)->
                                   _M_p + local_a8.super_VectorView<unsigned_int>.buffer_size * 4),
                   puVar25 + uVar14,puVar25 + (local_120 & 0xffffffff));
      }
LAB_002c1ead:
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_local_buf[0] = '\0';
      if (local_10c == local_110) {
        CompilerGLSL::access_chain_abi_cxx11_
                  (&local_c8,&this->super_CompilerGLSL,local_124,
                   local_a8.super_VectorView<unsigned_int>.ptr,
                   (uint32_t)local_a8.super_VectorView<unsigned_int>.buffer_size,local_100,&local_f8
                   ,(bool)(bVar10 ^ 1));
      }
      else {
        uVar22 = (ulong)local_124;
        if ((((uVar22 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.buffer_size) &&
             (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr,
             pVVar3[uVar22].type == TypeExpression)) &&
            (pSVar21 = Variant::get<spirv_cross::SPIRExpression>(pVVar3 + uVar22), bVar8)) &&
           (bVar9 && (pSVar21->implied_read_expressions).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 2
           )) {
          CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_124,true)
          ;
          ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_a8.super_VectorView<unsigned_int>.ptr;
          CompilerGLSL::access_chain_internal_abi_cxx11_
                    (&local_70,&this->super_CompilerGLSL,local_ec,
                     local_a8.super_VectorView<unsigned_int>.ptr,
                     (uint32_t)local_a8.super_VectorView<unsigned_int>.buffer_size,2,&local_f8);
          join<std::__cxx11::string,std::__cxx11::string>
                    (&local_c8,(spirv_cross *)&local_50,&local_70,ts_1);
          ::std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          psVar6 = &local_50;
          goto LAB_002c2069;
        }
        CompilerGLSL::access_chain_internal_abi_cxx11_
                  (&local_c8,&this->super_CompilerGLSL,local_124,
                   local_a8.super_VectorView<unsigned_int>.ptr,
                   (uint32_t)local_a8.super_VectorView<unsigned_int>.buffer_size,0,&local_f8);
      }
      ::std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_c8);
      psVar6 = &local_c8;
      local_50._M_dataplus._M_p = local_c8._M_dataplus._M_p;
LAB_002c2069:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &psVar6->field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pSVar17 = Compiler::get_variable_data_type((Compiler *)this,local_130);
      bVar7 = Compiler::has_extended_decoration
                        ((Compiler *)this,puVar25[2],SPIRVCrossDecorationTessIOOriginalInputTypeID);
      if (bVar7) {
        uVar13 = Compiler::get_extended_decoration
                           ((Compiler *)this,puVar25[2],
                            SPIRVCrossDecorationTessIOOriginalInputTypeID);
        pSVar17 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + uVar13);
      }
      if (3 < (uint)local_120) {
        uVar26 = local_120 & 0xffffffff;
        uVar22 = 3;
        do {
          bVar7 = Compiler::is_array((Compiler *)this,pSVar17);
          if ((bVar7) || (*(int *)&(pSVar17->super_IVariant).field_0xc != 0xf)) {
            pTVar24 = &pSVar17->parent_type;
          }
          else {
            pSVar19 = Variant::get<spirv_cross::SPIRConstant>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + puVar25[uVar22]);
            pTVar24 = (pSVar17->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr +
                      (pSVar19->m).c[0].r[0].u32;
          }
          pSVar17 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + pTVar24->id);
          uVar22 = uVar22 + 1;
        } while (uVar26 != uVar22);
      }
      bVar7 = Compiler::is_array((Compiler *)this,pSVar17);
      if (((!bVar7) && (bVar7 = Compiler::is_matrix((Compiler *)this,pSVar17), !bVar7)) &&
         ((*(int *)&(pSVar17->super_IVariant).field_0xc != 0xf &&
          (local_100->vecsize < pSVar17->vecsize)))) {
        CompilerGLSL::vector_swizzle(local_100->vecsize,0);
        ::std::__cxx11::string::append((char *)&local_e8);
      }
      uVar13 = puVar25[1];
      bVar7 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,puVar25[2]);
      local_c8._M_dataplus._M_p._0_1_ = bVar7;
      pSVar21 = Compiler::
                set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int_const&,bool>
                          ((Compiler *)this,uVar13,&local_e8,puVar25,(bool *)&local_c8);
      puVar1 = puVar25 + 1;
      (pSVar21->loaded_from).id = (local_130->super_IVariant).self.id;
      pSVar21->need_transpose = local_f8.need_transpose;
      pSVar21->access_chain = true;
      if (local_f8.storage_is_packed == true) {
        Compiler::set_extended_decoration
                  ((Compiler *)this,*puVar1,SPIRVCrossDecorationPhysicalTypePacked,0);
      }
      if (local_f8.storage_physical_type != 0) {
        Compiler::set_extended_decoration
                  ((Compiler *)this,*puVar1,SPIRVCrossDecorationPhysicalTypeID,
                   local_f8.storage_physical_type);
      }
      if (local_f8.storage_is_invariant == true) {
        Compiler::set_decoration((Compiler *)this,(ID)*puVar1,DecorationInvariant,0);
      }
      Compiler::set_extended_decoration
                ((Compiler *)this,*puVar1,SPIRVCrossDecorationTessIOOriginalInputTypeID,
                 (pSVar17->super_IVariant).self.id);
      local_130 = (SPIRVariable *)&(this->super_CompilerGLSL).super_Compiler.forwarded_temporaries;
      local_c8._M_dataplus._M_p = (pointer)local_130;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_130,puVar1);
      local_c8._M_dataplus._M_p =
           (pointer)&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_c8._M_dataplus._M_p,puVar1);
      puVar25 = local_108;
      if (2 < (uint)local_120) {
        uVar22 = local_120 & 0xffffffff;
        uVar26 = 2;
        do {
          Compiler::inherit_expression_dependencies((Compiler *)this,puVar25[1],puVar25[uVar26]);
          Compiler::add_implied_read_expression((Compiler *)this,pSVar21,puVar25[uVar26]);
          uVar26 = uVar26 + 1;
        } while (uVar22 != uVar26);
      }
      if ((pSVar21->expression_dependencies).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size == 0) {
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_130,puVar1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      local_a8.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)local_a8.super_VectorView<unsigned_int>.ptr ==
          &local_a8.stack_storage) {
        return true;
      }
      free(local_a8.super_VectorView<unsigned_int>.ptr);
      return true;
    }
  }
  id.id = (local_130->super_IVariant).self.id;
LAB_002c1802:
  pSVar16 = local_130;
  pMVar18 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,id);
  EVar12 = Compiler::get_execution_model((Compiler *)this);
  if (pSVar16 == (SPIRVariable *)0x0) {
    return false;
  }
  if (pMVar18 == (Meta *)0x0) {
    return false;
  }
  if (EVar12 != ExecutionModelTessellationControl) {
    return false;
  }
  if ((((pMVar18->decoration).builtin_type == BuiltInTessLevelInner) &&
      (bVar7 = Compiler::is_tessellating_triangles((Compiler *)this), bVar7)) &&
     ((uVar22 = (ulong)ops[3],
      (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
      buffer_size <= uVar22 ||
      ((pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar22].type != TypeConstant ||
       (pSVar19 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar22),
       (pSVar19->m).c[0].r[0].u32 != 1)))))) {
    pSVar16 = Compiler::set<spirv_cross::SPIRVariable,spirv_cross::SPIRVariable&>
                        ((Compiler *)this,ops[1],local_130);
    *(uint32_t *)&(pSVar16->super_IVariant).field_0xc = *ops;
    this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
    local_a8.super_VectorView<unsigned_int>.ptr =
         (uint *)CONCAT44(local_a8.super_VectorView<unsigned_int>.ptr._4_4_,ops[2]);
    pmVar20 = ::std::__detail::
              _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,(key_type *)&local_a8);
    local_e8._M_dataplus._M_p._0_4_ = ops[1];
    this_01 = ::std::__detail::
              _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,(key_type *)&local_e8);
    Meta::operator=(this_01,pmVar20);
    Compiler::inherit_expression_dependencies((Compiler *)this,ops[1],ops[2]);
    return true;
  }
  return false;
}

Assistant:

bool CompilerMSL::emit_tessellation_access_chain(const uint32_t *ops, uint32_t length)
{
	// If this is a per-vertex output, remap it to the I/O array buffer.

	// Any object which did not go through IO flattening shenanigans will go there instead.
	// We will unflatten on-demand instead as needed, but not all possible cases can be supported, especially with arrays.

	auto *var = maybe_get_backing_variable(ops[2]);
	bool patch = false;
	bool flat_data = false;
	bool ptr_is_chain = false;
	bool flatten_composites = false;

	bool is_block = false;
	bool is_arrayed = false;

	if (var)
	{
		auto &type = get_variable_data_type(*var);
		is_block = has_decoration(type.self, DecorationBlock);
		is_arrayed = !type.array.empty();

		flatten_composites = variable_storage_requires_stage_io(var->storage);
		patch = has_decoration(ops[2], DecorationPatch) || is_patch_block(type);

		// Should match strip_array in add_interface_block.
		flat_data = var->storage == StorageClassInput || (var->storage == StorageClassOutput && is_tesc_shader());

		// Patch inputs are treated as normal block IO variables, so they don't deal with this path at all.
		if (patch && (!is_block || is_arrayed || var->storage == StorageClassInput))
			flat_data = false;

		// We might have a chained access chain, where
		// we first take the access chain to the control point, and then we chain into a member or something similar.
		// In this case, we need to skip gl_in/gl_out remapping.
		// Also, skip ptr chain for patches.
		ptr_is_chain = var->self != ID(ops[2]);
	}

	bool builtin_variable = false;
	bool variable_is_flat = false;

	if (var && flat_data)
	{
		builtin_variable = is_builtin_variable(*var);

		BuiltIn bi_type = BuiltInMax;
		if (builtin_variable && !is_block)
			bi_type = BuiltIn(get_decoration(var->self, DecorationBuiltIn));

		variable_is_flat = !builtin_variable || is_block ||
		                   bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
		                   bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance;
	}

	if (variable_is_flat)
	{
		// If output is masked, it is emitted as a "normal" variable, just go through normal code paths.
		// Only check this for the first level of access chain.
		// Dealing with this for partial access chains should be possible, but awkward.
		if (var->storage == StorageClassOutput && !ptr_is_chain)
		{
			bool masked = false;
			if (is_block)
			{
				uint32_t relevant_member_index = patch ? 3 : 4;
				// FIXME: This won't work properly if the application first access chains into gl_out element,
				// then access chains into the member. Super weird, but theoretically possible ...
				if (length > relevant_member_index)
				{
					uint32_t mbr_idx = get<SPIRConstant>(ops[relevant_member_index]).scalar();
					masked = is_stage_output_block_member_masked(*var, mbr_idx, true);
				}
			}
			else if (var)
				masked = is_stage_output_variable_masked(*var);

			if (masked)
				return false;
		}

		AccessChainMeta meta;
		SmallVector<uint32_t> indices;
		uint32_t next_id = ir.increase_bound_by(1);

		indices.reserve(length - 3 + 1);

		uint32_t first_non_array_index = (ptr_is_chain ? 3 : 4) - (patch ? 1 : 0);

		VariableID stage_var_id;
		if (patch)
			stage_var_id = var->storage == StorageClassInput ? patch_stage_in_var_id : patch_stage_out_var_id;
		else
			stage_var_id = var->storage == StorageClassInput ? stage_in_ptr_var_id : stage_out_ptr_var_id;

		VariableID ptr = ptr_is_chain ? VariableID(ops[2]) : stage_var_id;
		if (!ptr_is_chain && !patch)
		{
			// Index into gl_in/gl_out with first array index.
			indices.push_back(ops[first_non_array_index - 1]);
		}

		auto &result_ptr_type = get<SPIRType>(ops[0]);

		uint32_t const_mbr_id = next_id++;
		uint32_t index = get_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex);

		// If we have a pointer chain expression, and we are no longer pointing to a composite
		// object, we are in the clear. There is no longer a need to flatten anything.
		bool further_access_chain_is_trivial = false;
		if (ptr_is_chain && flatten_composites)
		{
			auto &ptr_type = expression_type(ptr);
			if (!is_array(ptr_type) && !is_matrix(ptr_type) && ptr_type.basetype != SPIRType::Struct)
				further_access_chain_is_trivial = true;
		}

		if (!further_access_chain_is_trivial && (flatten_composites || is_block))
		{
			uint32_t i = first_non_array_index;
			auto *type = &get_variable_element_type(*var);
			if (index == uint32_t(-1) && length >= (first_non_array_index + 1))
			{
				// Maybe this is a struct type in the input class, in which case
				// we put it as a decoration on the corresponding member.
				uint32_t mbr_idx = get_constant(ops[first_non_array_index]).scalar();
				index = get_extended_member_decoration(var->self, mbr_idx,
				                                       SPIRVCrossDecorationInterfaceMemberIndex);
				assert(index != uint32_t(-1));
				i++;
				type = &get<SPIRType>(type->member_types[mbr_idx]);
			}

			// In this case, we're poking into flattened structures and arrays, so now we have to
			// combine the following indices. If we encounter a non-constant index,
			// we're hosed.
			for (; flatten_composites && i < length; ++i)
			{
				if (!is_array(*type) && !is_matrix(*type) && type->basetype != SPIRType::Struct)
					break;

				auto *c = maybe_get<SPIRConstant>(ops[i]);
				if (!c || c->specialization)
					SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable in tessellation. "
					                  "This is currently unsupported.");

				// We're in flattened space, so just increment the member index into IO block.
				// We can only do this once in the current implementation, so either:
				// Struct, Matrix or 1-dimensional array for a control point.
				if (type->basetype == SPIRType::Struct && var->storage == StorageClassOutput)
				{
					// Need to consider holes, since individual block members might be masked away.
					uint32_t mbr_idx = c->scalar();
					for (uint32_t j = 0; j < mbr_idx; j++)
						if (!is_stage_output_block_member_masked(*var, j, true))
							index++;
				}
				else
					index += c->scalar();

				if (type->parent_type)
					type = &get<SPIRType>(type->parent_type);
				else if (type->basetype == SPIRType::Struct)
					type = &get<SPIRType>(type->member_types[c->scalar()]);
			}

			// We're not going to emit the actual member name, we let any further OpLoad take care of that.
			// Tag the access chain with the member index we're referencing.
			bool defer_access_chain = flatten_composites && (is_matrix(result_ptr_type) || is_array(result_ptr_type) ||
			                                                 result_ptr_type.basetype == SPIRType::Struct);

			if (!defer_access_chain)
			{
				// Access the appropriate member of gl_in/gl_out.
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);

				// Member index is now irrelevant.
				index = uint32_t(-1);

				// Append any straggling access chain indices.
				if (i < length)
					indices.insert(indices.end(), ops + i, ops + length);
			}
			else
			{
				// We must have consumed the entire access chain if we're deferring it.
				assert(i == length);
			}

			if (index != uint32_t(-1))
				set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, index);
			else
				unset_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex);
		}
		else
		{
			if (index != uint32_t(-1))
			{
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);
			}

			// Member index is now irrelevant.
			index = uint32_t(-1);
			unset_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex);

			indices.insert(indices.end(), ops + first_non_array_index, ops + length);
		}

		// We use the pointer to the base of the input/output array here,
		// so this is always a pointer chain.
		string e;

		if (!ptr_is_chain)
		{
			// This is the start of an access chain, use ptr_chain to index into control point array.
			e = access_chain(ptr, indices.data(), uint32_t(indices.size()), result_ptr_type, &meta, !patch);
		}
		else
		{
			// If we're accessing a struct, we need to use member indices which are based on the IO block,
			// not actual struct type, so we have to use a split access chain here where
			// first path resolves the control point index, i.e. gl_in[index], and second half deals with
			// looking up flattened member name.

			// However, it is possible that we partially accessed a struct,
			// by taking pointer to member inside the control-point array.
			// For this case, we fall back to a natural access chain since we have already dealt with remapping struct members.
			// One way to check this here is if we have 2 implied read expressions.
			// First one is the gl_in/gl_out struct itself, then an index into that array.
			// If we have traversed further, we use a normal access chain formulation.
			auto *ptr_expr = maybe_get<SPIRExpression>(ptr);
			bool split_access_chain_formulation = flatten_composites && ptr_expr &&
			                                      ptr_expr->implied_read_expressions.size() == 2 &&
			                                      !further_access_chain_is_trivial;

			if (split_access_chain_formulation)
			{
				e = join(to_expression(ptr),
				         access_chain_internal(stage_var_id, indices.data(), uint32_t(indices.size()),
				                               ACCESS_CHAIN_CHAIN_ONLY_BIT, &meta));
			}
			else
			{
				e = access_chain_internal(ptr, indices.data(), uint32_t(indices.size()), 0, &meta);
			}
		}

		// Get the actual type of the object that was accessed. If it's a vector type and we changed it,
		// then we'll need to add a swizzle.
		// For this, we can't necessarily rely on the type of the base expression, because it might be
		// another access chain, and it will therefore already have the "correct" type.
		auto *expr_type = &get_variable_data_type(*var);
		if (has_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID))
			expr_type = &get<SPIRType>(get_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID));
		for (uint32_t i = 3; i < length; i++)
		{
			if (!is_array(*expr_type) && expr_type->basetype == SPIRType::Struct)
				expr_type = &get<SPIRType>(expr_type->member_types[get<SPIRConstant>(ops[i]).scalar()]);
			else
				expr_type = &get<SPIRType>(expr_type->parent_type);
		}
		if (!is_array(*expr_type) && !is_matrix(*expr_type) && expr_type->basetype != SPIRType::Struct &&
		    expr_type->vecsize > result_ptr_type.vecsize)
			e += vector_swizzle(result_ptr_type.vecsize, 0);

		auto &expr = set<SPIRExpression>(ops[1], std::move(e), ops[0], should_forward(ops[2]));
		expr.loaded_from = var->self;
		expr.need_transpose = meta.need_transpose;
		expr.access_chain = true;

		// Mark the result as being packed if necessary.
		if (meta.storage_is_packed)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypePacked);
		if (meta.storage_physical_type != 0)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypeID, meta.storage_physical_type);
		if (meta.storage_is_invariant)
			set_decoration(ops[1], DecorationInvariant);
		// Save the type we found in case the result is used in another access chain.
		set_extended_decoration(ops[1], SPIRVCrossDecorationTessIOOriginalInputTypeID, expr_type->self);

		// If we have some expression dependencies in our access chain, this access chain is technically a forwarded
		// temporary which could be subject to invalidation.
		// Need to assume we're forwarded while calling inherit_expression_depdendencies.
		forwarded_temporaries.insert(ops[1]);
		// The access chain itself is never forced to a temporary, but its dependencies might.
		suppressed_usage_tracking.insert(ops[1]);

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(expr, ops[i]);
		}

		// If we have no dependencies after all, i.e., all indices in the access chain are immutable temporaries,
		// we're not forwarded after all.
		if (expr.expression_dependencies.empty())
			forwarded_temporaries.erase(ops[1]);

		return true;
	}

	// If this is the inner tessellation level, and we're tessellating triangles,
	// drop the last index. It isn't an array in this case, so we can't have an
	// array reference here. We need to make this ID a variable instead of an
	// expression so we don't try to dereference it as a variable pointer.
	// Don't do this if the index is a constant 1, though. We need to drop stores
	// to that one.
	auto *m = ir.find_meta(var ? var->self : ID(0));
	if (is_tesc_shader() && var && m && m->decoration.builtin_type == BuiltInTessLevelInner &&
	    is_tessellating_triangles())
	{
		auto *c = maybe_get<SPIRConstant>(ops[3]);
		if (c && c->scalar() == 1)
			return false;
		auto &dest_var = set<SPIRVariable>(ops[1], *var);
		dest_var.basetype = ops[0];
		ir.meta[ops[1]] = ir.meta[ops[2]];
		inherit_expression_dependencies(ops[1], ops[2]);
		return true;
	}

	return false;
}